

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdb_typetable.cpp
# Opt level: O2

void __thiscall TypeTable::TypeTable(TypeTable *this,TPIStream *tpiStream)

{
  uint32_t uVar1;
  RecordHeader RVar2;
  Record **ppRVar3;
  ulong uVar4;
  ulong offset;
  CoalescedMSFStream local_40;
  
  uVar1 = (tpiStream->m_header).typeIndexEnd;
  this->typeIndexBegin = (tpiStream->m_header).typeIndexBegin;
  this->typeIndexEnd = uVar1;
  this->m_recordCount = tpiStream->m_recordCount;
  PDB::CoalescedMSFStream::CoalescedMSFStream(&this->m_stream);
  uVar4 = 0;
  PDB::CoalescedMSFStream::CoalescedMSFStream
            (&local_40,&tpiStream->m_stream,(tpiStream->m_stream).m_size,0);
  PDB::CoalescedMSFStream::operator=(&this->m_stream,&local_40);
  PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_40);
  ppRVar3 = (Record **)
            operator_new__(-(ulong)(this->m_recordCount >> 0x3d != 0) | this->m_recordCount << 3);
  this->m_records = ppRVar3;
  for (offset = 0x38; offset < (tpiStream->m_stream).m_size;
      offset = offset + ((uint)RVar2 & 0xffff) + 2) {
    RVar2 = PDB::DirectMSFStream::ReadAtOffset<PDB::CodeView::TPI::RecordHeader>
                      (&tpiStream->m_stream,offset);
    this->m_records[uVar4] = (Record *)((this->m_stream).m_data + offset);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  return;
}

Assistant:

TypeTable::TypeTable(const PDB::TPIStream& tpiStream) PDB_NO_EXCEPT
	: typeIndexBegin(tpiStream.GetFirstTypeIndex()), typeIndexEnd(tpiStream.GetLastTypeIndex()),
	m_recordCount(tpiStream.GetTypeRecordCount())
{
	// Create coalesced stream from TPI stream, so the records can be referenced directly using pointers.
	const PDB::DirectMSFStream& directStream = tpiStream.GetDirectMSFStream();
	m_stream = PDB::CoalescedMSFStream(directStream, directStream.GetSize(), 0);

	// types in the TPI stream are accessed by their index from other streams.
	// however, the index is not stored with types in the TPI stream directly, but has to be built while walking the stream.
	// similarly, because types are variable-length records, there are no direct offsets to access individual types.
	// we therefore walk the TPI stream once, and store pointers to the records for trivial O(1) array lookup by index later.	
	m_records = new const PDB::CodeView::TPI::Record*[m_recordCount];

	// parse the CodeView records
	uint32_t typeIndex = 0u;

	tpiStream.ForEachTypeRecordHeaderAndOffset([this, &typeIndex](const PDB::CodeView::TPI::RecordHeader& header, size_t offset)
		{
			// The header includes the record kind and size, which can be stored along with offset
			// to allow for lazy loading of the types on-demand directly from the TPIStream::GetDirectMSFStream()
			// using DirectMSFStream::ReadAtOffset(...). Thus not needing a CoalescedMSFStream to look up the types.
			(void)header;

			const PDB::CodeView::TPI::Record* record = m_stream.GetDataAtOffset<const PDB::CodeView::TPI::Record>(offset);
			m_records[typeIndex] = record;
			++typeIndex;
		});
}